

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_loddata(xr_ogf_v3 *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ogf3_vsplit *poVar7;
  uint16_t *puVar8;
  size_t num_vsplits;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  sVar4 = xr_reader::find_chunk(r,1);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xba,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  uVar3 = xr_reader::r_u32(r);
  this->m_min_vertices = uVar3;
  uVar3 = xr_reader::r_u32(r);
  this->m_min_indices = uVar3;
  xr_reader::debug_find_chunk(r);
  sVar4 = xr_reader::find_chunk(r,2);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc0,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  bVar2 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,7);
  if (!bVar2) {
    __assert_fail("is_chunk_loaded(OGF3_VERTICES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc1,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  sVar4 = xr_flexbuf::size(&(this->super_xr_ogf).m_vb.super_xr_flexbuf);
  uVar5 = sVar4 - this->m_min_vertices;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  poVar7 = (ogf3_vsplit *)operator_new__(uVar6);
  this->m_vsplits = poVar7;
  xr_reader::r_cseq<xray_re::ogf3_vsplit>(r,uVar5,this->m_vsplits);
  xr_reader::debug_find_chunk(r);
  sVar4 = xr_reader::find_chunk(r,3);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,200,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  uVar3 = xr_reader::r_u32(r);
  this->m_num_fix_faces = uVar3;
  auVar1 = ZEXT416(this->m_num_fix_faces) * ZEXT816(2);
  uVar5 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar8 = (uint16_t *)operator_new__(uVar5);
  this->m_fix_faces = puVar8;
  xr_reader::r_cseq<unsigned_short>(r,(ulong)this->m_num_fix_faces,this->m_fix_faces);
  xr_reader::debug_find_chunk(r);
  setup_ib0(this);
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,9);
  return;
}

Assistant:

inline void xr_ogf_v3::load_loddata(xr_reader& r)
{
	if (!r.find_chunk(OGF3_HOPPE_HEADER))
		xr_not_expected();
	m_min_vertices = r.r_u32();
	m_min_indices = r.r_u32();
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_VERT_SPLITS))
		xr_not_expected();
	xr_assert(is_chunk_loaded(OGF3_VERTICES));
	size_t num_vsplits = m_vb.size() - m_min_vertices;
	m_vsplits = new ogf3_vsplit[num_vsplits];
	r.r_cseq(num_vsplits, m_vsplits);
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_FIX_FACES))
		xr_not_expected();
	m_num_fix_faces = r.r_u32();
	m_fix_faces = new uint16_t[m_num_fix_faces];
	r.r_cseq(m_num_fix_faces, m_fix_faces);
	r.debug_find_chunk();

	setup_ib0();

	set_chunk_loaded(OGF3_LODDATA);
}